

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O0

void ZXing::SaveAsPBM(BitMatrix *matrix,string *filename,int quietZone)

{
  int iVar1;
  ostream *poVar2;
  value_t *pvVar3;
  EVP_PKEY_CTX *in_RDX;
  BitMatrix *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  ofstream file;
  Matrix<unsigned_char> out;
  undefined8 in_stack_fffffffffffffd60;
  undefined2 uVar4;
  ostream local_288 [36];
  int in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  BitMatrix *in_stack_fffffffffffffda8;
  BitMatrix local_78 [2];
  Matrix<unsigned_char> local_38;
  undefined4 local_14;
  
  uVar4 = (undefined2)((ulong)in_stack_fffffffffffffd60 >> 0x30);
  local_14 = SUB84(in_RDX,0);
  BitMatrix::copy(local_78,in_RDI,in_RDX);
  Inflate(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
          in_stack_fffffffffffffd9c);
  ToMatrix<unsigned_char>(in_RSI,(uchar)((ushort)uVar4 >> 8),(uchar)uVar4);
  BitMatrix::~BitMatrix((BitMatrix *)0x21ec48);
  BitMatrix::~BitMatrix((BitMatrix *)0x21ec55);
  std::ofstream::ofstream(local_288,in_RSI,0x10);
  poVar2 = std::operator<<(local_288,"P5\n");
  iVar1 = Matrix<unsigned_char>::width(&local_38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,' ');
  iVar1 = Matrix<unsigned_char>::height(&local_38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n255\n");
  pvVar3 = Matrix<unsigned_char>::data((Matrix<unsigned_char> *)0x21ed09);
  Matrix<unsigned_char>::size((Matrix<unsigned_char> *)0x21ed1d);
  std::ostream::write((char *)local_288,(long)pvVar3);
  std::ofstream::~ofstream(local_288);
  Matrix<unsigned_char>::~Matrix((Matrix<unsigned_char> *)0x21ed52);
  return;
}

Assistant:

void SaveAsPBM(const BitMatrix& matrix, const std::string filename, int quietZone)
{
	auto out = ToMatrix<uint8_t>(Inflate(matrix.copy(), 0, 0, quietZone));
	std::ofstream file(filename);
	file << "P5\n" << out.width() << ' ' << out.height() << "\n255\n";
	file.write(reinterpret_cast<const char*>(out.data()), out.size());
}